

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_4,_4> *mat;
  MatrixCaseUtils local_11c [12];
  MatrixCaseUtils local_110 [12];
  tcu local_104 [12];
  VecAccess<float,_4,_3> local_f8;
  MatrixCaseUtils local_e0 [64];
  Matrix<float,_4,_4> local_a0;
  Mat4 local_60;
  
  getInputValue<2,13>(&local_60,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  reduceToVec3(local_110,&local_60);
  getInputValue<2,13>((Mat4 *)local_e0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_a0,local_e0,mat);
  reduceToVec3(local_11c,&local_a0);
  tcu::operator+(local_104,(Vector<float,_3> *)local_110,(Vector<float,_3> *)local_11c);
  local_f8.m_vector = &evalCtx->color;
  local_f8.m_index[0] = 0;
  local_f8.m_index[1] = 1;
  local_f8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_f8,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}